

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_oct.c
# Opt level: O2

REF_STATUS ref_oct_export_tet(REF_OCT ref_oct,REF_INT node,REF_GRID ref_grid,REF_INT *tri_nodes)

{
  REF_INT *pRVar1;
  uint uVar2;
  long lVar3;
  REF_INT new_cell;
  REF_INT tet_nodes [27];
  
  pRVar1 = ref_oct->nodes;
  tet_nodes[0] = pRVar1[(long)*tri_nodes + (long)node * 0x1b];
  lVar3 = (long)(int)((long)node * 0x1b);
  tet_nodes[1] = pRVar1[tri_nodes[1] + lVar3];
  tet_nodes[2] = pRVar1[tri_nodes[2] + lVar3];
  tet_nodes[3] = pRVar1[lVar3 + 0x1a];
  uVar2 = ref_cell_add(ref_grid->cell[8],tet_nodes,&new_cell);
  if (uVar2 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_oct.c",0x376,
           "ref_oct_export_tet",(ulong)uVar2,"add tri tet");
    printf("tri %d %d %d tet %d %d %d %d\n",(ulong)(uint)*tri_nodes,(ulong)(uint)tri_nodes[1],
           (ulong)(uint)tri_nodes[2],(ulong)(uint)tet_nodes[0],(ulong)(uint)tet_nodes[1],
           (ulong)(uint)tet_nodes[2],(ulong)(uint)tet_nodes[3]);
  }
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_oct_export_tet(REF_OCT ref_oct, REF_INT node,
                                             REF_GRID ref_grid,
                                             REF_INT *tri_nodes) {
  REF_CELL ref_cell = ref_grid_tet(ref_grid);
  REF_INT tet_nodes[REF_CELL_MAX_SIZE_PER], new_cell;
  tet_nodes[0] = ref_oct_c2n(ref_oct, tri_nodes[0], node);
  tet_nodes[1] = ref_oct_c2n(ref_oct, tri_nodes[1], node);
  tet_nodes[2] = ref_oct_c2n(ref_oct, tri_nodes[2], node);
  tet_nodes[3] = ref_oct_c2n(ref_oct, 26, node);
  RSB(ref_cell_add(ref_cell, tet_nodes, &new_cell), "add tri tet", {
    printf("tri %d %d %d tet %d %d %d %d\n", tri_nodes[0], tri_nodes[1],
           tri_nodes[2], tet_nodes[0], tet_nodes[1], tet_nodes[2],
           tet_nodes[3]);
  });
  return REF_SUCCESS;
}